

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O1

vi2d __thiscall olc::TransformedView::ScaleToScreen(TransformedView *this,vf2d *vWorldSize)

{
  float fVar1;
  float *in_RDX;
  float fVar2;
  float fVar3;
  
  fVar3 = in_RDX[1];
  fVar1 = vWorldSize[2].y;
  fVar2 = floorf(*in_RDX * vWorldSize[2].x);
  fVar3 = floorf(fVar3 * fVar1);
  *(int *)&(this->super_PGEX)._vptr_PGEX = (int)fVar2;
  *(int *)((long)&(this->super_PGEX)._vptr_PGEX + 4) = (int)fVar3;
  return (vi2d)this;
}

Assistant:

olc::vi2d TransformedView::ScaleToScreen(const olc::vf2d& vWorldSize) const
	{
		olc::vf2d vFloat = vWorldSize * m_vWorldScale;		
		return vFloat.floor();
	}